

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::CLUFactor<double>::vSolveUrightNoNZ
          (CLUFactor<double> *this,double *vec,double *rhs,int *ridx,int rn,double eps)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  pointer pdVar7;
  int *piVar8;
  int *piVar9;
  pointer pdVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  double *pdVar16;
  long lVar17;
  ulong uVar18;
  int *piVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  double dVar23;
  double dVar24;
  
  if (0 < rn) {
    piVar3 = (this->row).orig;
    piVar4 = (this->row).perm;
    piVar5 = (this->col).orig;
    piVar6 = (this->u).col.idx;
    pdVar7 = (this->u).col.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->u).col.len;
    piVar9 = (this->u).col.start;
    pdVar10 = (this->diag).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      uVar13 = *ridx;
      uVar18 = (ulong)uVar13;
      if ((double)(int)uVar13 * 0.2 < (double)rn) {
        if ((int)uVar13 < 0) {
          return;
        }
        do {
          iVar1 = piVar3[uVar18];
          dVar23 = pdVar10[iVar1] * rhs[iVar1];
          rhs[iVar1] = 0.0;
          if (eps < ABS(dVar23)) {
            iVar1 = piVar5[uVar18];
            vec[iVar1] = dVar23;
            iVar22 = piVar8[iVar1];
            if (0 < iVar22) {
              lVar17 = (long)piVar9[iVar1] << 2;
              uVar13 = iVar22 + 1;
              do {
                iVar1 = *(int *)((long)piVar6 + lVar17);
                rhs[iVar1] = rhs[iVar1] - *(double *)((long)pdVar7 + lVar17 * 2) * dVar23;
                lVar17 = lVar17 + 4;
                uVar13 = uVar13 - 1;
              } while (1 < uVar13);
            }
          }
          bVar11 = 0 < (long)uVar18;
          uVar18 = uVar18 - 1;
        } while (bVar11);
        return;
      }
      uVar14 = rn - 1;
      uVar18 = (ulong)uVar14;
      iVar1 = ridx[uVar18];
      if ((uint)rn < 4) {
        iVar21 = 1;
        iVar22 = 0;
      }
      else {
        iVar21 = 1;
        iVar22 = 0;
        do {
          iVar2 = ridx[iVar21];
          iVar12 = ridx[(long)iVar21 + 1];
          if (iVar12 < iVar2) {
            iVar20 = iVar21;
            iVar12 = iVar2;
            if (iVar2 <= iVar1) goto LAB_001e0eb4;
          }
          else {
            if (iVar12 <= iVar1) goto LAB_001e0eb4;
            iVar20 = iVar21 + 1;
          }
          ridx[iVar22] = iVar12;
          iVar21 = iVar20 * 2 + 1;
          iVar22 = iVar20;
        } while (iVar21 < (int)(rn - 2U));
      }
      if ((iVar21 < (int)uVar14) && (iVar1 < ridx[iVar21])) {
        ridx[iVar22] = ridx[iVar21];
        iVar22 = iVar21;
      }
LAB_001e0eb4:
      ridx[iVar22] = iVar1;
      iVar1 = piVar3[(int)uVar13];
      dVar23 = pdVar10[iVar1] * rhs[iVar1];
      rhs[iVar1] = 0.0;
      rn = uVar14;
      if (eps < ABS(dVar23)) {
        iVar1 = piVar5[(int)uVar13];
        vec[iVar1] = dVar23;
        iVar22 = piVar8[iVar1];
        if (0 < iVar22) {
          iVar1 = piVar9[iVar1];
          piVar19 = piVar6 + iVar1;
          pdVar16 = pdVar7 + iVar1;
          do {
            iVar1 = *piVar19;
            dVar24 = rhs[iVar1];
            if ((dVar24 != 0.0) || (NAN(dVar24))) {
              dVar24 = dVar24 - *pdVar16 * dVar23;
              rhs[iVar1] = (double)(-(ulong)(dVar24 == 0.0) & 0x2b2bff2ee48e0530) + dVar24;
            }
            else {
              dVar24 = *pdVar16 * -dVar23;
              if (eps < ABS(dVar24)) {
                rhs[iVar1] = dVar24;
                iVar1 = piVar4[iVar1];
                iVar21 = (int)uVar18;
                uVar15 = uVar18;
                if (0 < iVar21) {
                  do {
                    uVar13 = (int)uVar18 - 1;
                    uVar14 = uVar13 >> 1;
                    uVar15 = uVar18;
                    if (iVar1 <= ridx[uVar14]) break;
                    ridx[uVar18] = ridx[uVar14];
                    uVar18 = (ulong)uVar14;
                    uVar15 = (ulong)uVar14;
                  } while (1 < uVar13);
                }
                uVar18 = (ulong)(iVar21 + 1);
                ridx[(int)uVar15] = iVar1;
              }
            }
            rn = (int)uVar18;
            piVar19 = piVar19 + 1;
            pdVar16 = pdVar16 + 1;
            bVar11 = 1 < iVar22;
            iVar22 = iVar22 + -1;
          } while (bVar11);
        }
      }
    } while (0 < rn);
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveUrightNoNZ(R* vec,
                                    R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   while(rn > 0)
   {
      if(rn > *ridx * verySparseFactor4right)
      {
         /* continue with dense case */
         for(i = *ridx; i >= 0; --i)
         {
            assert(i >= 0 && i < thedim);
            r = rorig[i];
            assert(r >= 0 && r < thedim);
            x = diag[r] * rhs[r];
            rhs[r] = 0;

            if(isNotZero(x, eps))
            {
               c = corig[i];
               vec[c] = x;
               val = &cval[cbeg[c]];
               idx = &cidx[cbeg[c]];
               j = clen[c];

               while(j-- > 0)
               {
                  assert(*idx >= 0 && *idx < thedim);
                  rhs[*idx++] -= x * (*val++);
               }
            }
         }

         break;
      }

      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);

      assert(i >= 0 && i < thedim);

      r = rorig[i];

      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];

      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }
      }
   }
}